

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O2

int run_test_tcp_open_twice(void)

{
  uv_os_sock_t uVar1;
  uv_os_sock_t __fd;
  int iVar2;
  undefined8 uVar3;
  uv_loop_t *loop;
  char *pcVar4;
  uv_tcp_t client;
  
  uVar1 = create_tcp_socket();
  __fd = create_tcp_socket();
  uVar3 = uv_default_loop();
  iVar2 = uv_tcp_init(uVar3,&client);
  if (iVar2 == 0) {
    iVar2 = uv_tcp_open(&client,uVar1);
    if (iVar2 == 0) {
      iVar2 = uv_tcp_open(&client,__fd);
      if (iVar2 == -0x10) {
        iVar2 = close(__fd);
        if (iVar2 == 0) {
          uv_close(&client,0);
          uVar3 = uv_default_loop();
          uv_run(uVar3,0);
          loop = (uv_loop_t *)uv_default_loop();
          close_loop(loop);
          uVar3 = uv_default_loop();
          iVar2 = uv_loop_close(uVar3);
          if (iVar2 == 0) {
            return 0;
          }
          pcVar4 = "0 == uv_loop_close(uv_default_loop())";
          uVar3 = 0x132;
        }
        else {
          pcVar4 = "r == 0";
          uVar3 = 0x54;
        }
      }
      else {
        pcVar4 = "r == UV_EBUSY";
        uVar3 = 300;
      }
    }
    else {
      pcVar4 = "r == 0";
      uVar3 = 0x129;
    }
  }
  else {
    pcVar4 = "r == 0";
    uVar3 = 0x126;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(tcp_open_twice) {
  uv_tcp_t client;
  uv_os_sock_t sock1, sock2;
  int r;

  startup();
  sock1 = create_tcp_socket();
  sock2 = create_tcp_socket();

  r = uv_tcp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  r = uv_tcp_open(&client, sock1);
  ASSERT(r == 0);

  r = uv_tcp_open(&client, sock2);
  ASSERT(r == UV_EBUSY);
  close_socket(sock2);

  uv_close((uv_handle_t*) &client, NULL);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}